

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O3

void __thiscall
dg::pta::PointerAnalysisFSInv::PointerAnalysisFSInv
          (PointerAnalysisFSInv *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  *this_00;
  PointerAnalysisOptions local_68;
  
  opts->invalidateNodes = true;
  local_68.super_AnalysisOptions.fieldSensitivity.offset =
       (opts->super_AnalysisOptions).fieldSensitivity.offset;
  this_00 = &local_68.super_AnalysisOptions.allocationFunctions;
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_Rb_tree(&this_00->_M_t,&(opts->super_AnalysisOptions).allocationFunctions._M_t);
  local_68.preprocessGeps = opts->preprocessGeps;
  local_68.invalidateNodes = opts->invalidateNodes;
  local_68._58_6_ = *(undefined6 *)&opts->field_0x3a;
  local_68.maxIterations = opts->maxIterations;
  PointerAnalysisFS::PointerAnalysisFS(&this->super_PointerAnalysisFS,ps,&local_68);
  std::
  _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
  ::_M_erase(&this_00->_M_t,
             (_Link_type)
             local_68.super_AnalysisOptions.allocationFunctions._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent);
  (this->super_PointerAnalysisFS).super_PointerAnalysis._vptr_PointerAnalysis =
       (_func_int **)&PTR__PointerAnalysisFS_00133aa8;
  return;
}

Assistant:

PointerAnalysisFSInv(PointerGraph *ps, PointerAnalysisOptions opts)
            : PointerAnalysisFS(ps, opts.setInvalidateNodes(true)) {}